

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::read_int(Simulator *this,PCode *code)

{
  string *name;
  Symbol *this_00;
  Symbol *symbol;
  PCode *pPStack_18;
  int input;
  PCode *code_local;
  Simulator *this_local;
  
  symbol._4_4_ = 0;
  pPStack_18 = code;
  code_local = (PCode *)this;
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&symbol + 4));
  name = PCode::first_abi_cxx11_(pPStack_18);
  this_00 = ScopeTree::resolve(&this->tree_,name);
  Symbol::set_value(this_00,(int *)((long)&symbol + 4));
  Symbol::set_assigned(this_00);
  inc_eip(this);
  return;
}

Assistant:

void Simulator::read_int(const PCode &code) {
    int input = 0;
    std::cin >> input;
    Symbol &symbol = tree_.resolve(code.first());
    symbol.set_value(input);
    symbol.set_assigned();

    inc_eip();
}